

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_DCtx_reset(ZSTD_DCtx *dctx,ZSTD_ResetDirective reset)

{
  size_t sVar1;
  
  if ((reset & ~ZSTD_reset_parameters) == ZSTD_reset_session_only) {
    dctx->streamStage = zdss_init;
    dctx->noForwardProgress = 0;
    dctx->isFrameDecompression = 1;
  }
  if ((reset & ~ZSTD_reset_session_only) == ZSTD_reset_parameters) {
    sVar1 = 0xffffffffffffffc4;
    if (dctx->streamStage == zdss_init) {
      ZSTD_freeDDict(dctx->ddictLocal);
      sVar1 = 0;
      dctx->dictUses = ZSTD_dont_use;
      dctx->ddictLocal = (ZSTD_DDict *)0x0;
      dctx->ddict = (ZSTD_DDict *)0x0;
      dctx->format = ZSTD_f_zstd1;
      dctx->forceIgnoreChecksum = ZSTD_d_validateChecksum;
      dctx->maxWindowSize = 0x8000001;
      dctx->outBufferMode = ZSTD_bm_buffered;
      dctx->refMultipleDDicts = ZSTD_rmd_refSingleDDict;
      dctx->disableHufAsm = 0;
      dctx->maxBlockSizeParam = 0;
    }
  }
  else {
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

size_t ZSTD_DCtx_reset(ZSTD_DCtx* dctx, ZSTD_ResetDirective reset)
{
    if ( (reset == ZSTD_reset_session_only)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        dctx->streamStage = zdss_init;
        dctx->noForwardProgress = 0;
        dctx->isFrameDecompression = 1;
    }
    if ( (reset == ZSTD_reset_parameters)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        RETURN_ERROR_IF(dctx->streamStage != zdss_init, stage_wrong, "");
        ZSTD_clearDict(dctx);
        ZSTD_DCtx_resetParameters(dctx);
    }
    return 0;
}